

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O0

int __thiscall PyCode::mainFunc(PyCode *this,string *cwd)

{
  ostream *poVar1;
  FileNotOpenException *e;
  string local_90 [32];
  string local_70 [32];
  string local_50 [48];
  string *local_20;
  string *cwd_local;
  PyCode *this_local;
  
  local_20 = cwd;
  cwd_local = (string *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,">>Now generating MFStruct.py");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_50,(string *)cwd);
  generateMFStructPy(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,">>Now generating PostrgresCon.py");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_70,(string *)cwd);
  generatePostgresConPy(this,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  poVar1 = std::operator<<((ostream *)&std::cout,">>Now generating Main.py");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_90,(string *)cwd);
  generateMainPy(this,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::string((string *)&e,(string *)cwd);
  generateRequirements(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  return 0;
}

Assistant:

int PyCode::mainFunc(std::string cwd) noexcept
{
    try
    {
        std::cout << ">>Now generating MFStruct.py" << std::endl;
        this->generateMFStructPy(cwd);
        std::cout << ">>Now generating PostrgresCon.py" << std::endl;
        this->generatePostgresConPy(cwd);
        std::cout << ">>Now generating Main.py" << std::endl;
        this->generateMainPy(cwd);
        this->generateRequirements(cwd);
    }
    catch(ParserClassException::FileNotOpenException &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}